

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O2

int16_t calc_slot_mod(EOPLL *opll,int ch)

{
  uint32_t uVar1;
  EOPLL_PATCH *pEVar2;
  int16_t iVar3;
  int iVar4;
  ushort am;
  
  pEVar2 = opll->slot[ch * 2].patch;
  uVar1 = pEVar2->FB;
  if (uVar1 == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = (int)(short)(opll->slot[ch * 2].output[0] + opll->slot[ch * 2].output[1] >>
                        (9U - (char)uVar1 & 0x1f));
  }
  if (pEVar2->AM == 0) {
    am = 0;
  }
  else {
    am = (ushort)opll->lfo_am;
  }
  opll->slot[ch * 2].output[1] = opll->slot[ch * 2].output[0];
  iVar3 = to_linear(opll->slot[ch * 2].wave_table[iVar4 + opll->slot[ch * 2].pg_out & 0x3ff],
                    opll->slot + ch * 2,am);
  opll->slot[ch * 2].output[0] = (int)iVar3;
  return iVar3;
}

Assistant:

static INLINE int16_t calc_slot_mod(EOPLL *opll, int ch) {
  EOPLL_SLOT *slot = MOD(opll, ch);

  int16_t fm = slot->patch->FB > 0 ? (slot->output[1] + slot->output[0]) >> (9 - slot->patch->FB) : 0;
  uint8_t am = slot->patch->AM ? opll->lfo_am : 0;

  slot->output[1] = slot->output[0];
  slot->output[0] = to_linear(slot->wave_table[(slot->pg_out + fm) & (PG_WIDTH - 1)], slot, am);

  return slot->output[0];
}